

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<true>::nameSpaceInfo(TC_parser<true> *this)

{
  size_t sVar1;
  char **ppcVar2;
  uint64_t uVar3;
  TC_parser<true> *in_RDI;
  v_array<char> base_v_array;
  substring name;
  char *in_stack_00000080;
  char *in_stack_00000088;
  char *in_stack_00000090;
  char *in_stack_00000098;
  TC_parser<true> *in_stack_000000a0;
  v_array<char> *in_stack_ffffffffffffffb0;
  TC_parser<true> *this_00;
  char *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  v_array<char> local_38;
  substring local_18;
  
  if ((((in_RDI->reading_head == in_RDI->endLine) || (*in_RDI->reading_head == '|')) ||
      (*in_RDI->reading_head == ' ')) ||
     (((*in_RDI->reading_head == '\t' || (*in_RDI->reading_head == ':')) ||
      (*in_RDI->reading_head == '\r')))) {
    parserWarning(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                  in_stack_00000080);
  }
  else {
    in_RDI->index = *in_RDI->reading_head;
    if ((in_RDI->redefine_some & 1U) != 0) {
      in_RDI->index = (*in_RDI->redefine)[in_RDI->index];
    }
    sVar1 = features::size((features *)0x3f19e0);
    if (sVar1 == 0) {
      in_RDI->new_index = true;
    }
    local_18 = read_name(in_RDI);
    v_init<char>();
    push_many<char>((v_array<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
    v_array<char>::push_back(in_stack_ffffffffffffffb0,(char *)in_RDI);
    if (in_RDI->base != (char *)0x0) {
      free(in_RDI->base);
    }
    ppcVar2 = v_array<char>::begin(&local_38);
    in_RDI->base = *ppcVar2;
    this_00 = (TC_parser<true> *)local_18.begin;
    uVar3 = (*in_RDI->p->hasher)(local_18,(ulong)in_RDI->hash_seed);
    in_RDI->channel_hash = uVar3;
    nameSpaceInfoValue(this_00);
  }
  return;
}

Assistant:

inline void nameSpaceInfo()
  {
    if (reading_head == endLine || *reading_head == '|' || *reading_head == ' ' || *reading_head == '\t' ||
        *reading_head == ':' || *reading_head == '\r')
    {
      // syntax error
      parserWarning("malformed example! String expected after : \"", beginLine, reading_head, "\"");
    }
    else
    {
      // NameSpaceInfo --> 'String' NameSpaceInfoValue
      index = (unsigned char)(*reading_head);
      if (redefine_some)
        index = (*redefine)[index];  // redefine index
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      substring name = read_name();
      if (audit)
      {
        v_array<char> base_v_array = v_init<char>();
        push_many(base_v_array, name.begin, name.end - name.begin);
        base_v_array.push_back('\0');
        if (base != nullptr)
          free(base);
        base = base_v_array.begin();
      }
      channel_hash = p->hasher(name, this->hash_seed);
      nameSpaceInfoValue();
    }
  }